

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool cmFortranStreamContainsSequence(istream *ifs,char *seq,int len)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (len < 1) {
    return true;
  }
  iVar2 = 0;
  do {
    iVar1 = std::istream::get();
    bVar3 = ((byte)ifs[*(long *)(*(long *)ifs + -0x18) + 0x20] & 5) == 0;
    if (!bVar3) {
      return bVar3;
    }
    if (iVar1 == seq[iVar2]) {
      iVar2 = iVar2 + 1;
    }
    else {
      iVar2 = 0;
    }
  } while (iVar2 < len);
  return bVar3;
}

Assistant:

static
bool cmFortranStreamContainsSequence(std::istream& ifs,
                                            const char* seq, int len)
{
  assert(len > 0);

  int cur = 0;
  while(cur < len)
    {
    // Get the next character.
    int token = ifs.get();
    if(!ifs)
      {
      return false;
      }

    // Check the character.
    if(token == static_cast<int>(seq[cur]))
      {
      ++cur;
      }
    else
      {
      // Assume the sequence has no repeating subsequence.
      cur = 0;
      }
    }

  // The entire sequence was matched.
  return true;
}